

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.hpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLDateTime::setBuffer(XMLDateTime *this,XMLCh *aString)

{
  bool bVar1;
  int iVar2;
  XMLSize_t XVar3;
  undefined4 extraout_var;
  XMLCh *aString_local;
  XMLDateTime *this_local;
  
  reset(this);
  XVar3 = XMLString::stringLen(aString);
  this->fEnd = XVar3;
  while ((this->fEnd != 0 && (bVar1 = XMLChar1_0::isWhitespace(aString[this->fEnd - 1]), bVar1))) {
    this->fEnd = this->fEnd - 1;
  }
  if (this->fEnd != 0) {
    if (this->fBufferMaxLen < this->fEnd) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fBuffer);
      this->fBufferMaxLen = this->fEnd + 8;
      iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                        (this->fMemoryManager,(this->fBufferMaxLen + 1) * 2);
      this->fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar2);
    }
    memcpy(this->fBuffer,aString,this->fEnd << 1);
    this->fBuffer[this->fEnd] = L'\0';
  }
  return;
}

Assistant:

inline void XMLDateTime::setBuffer(const XMLCh* const aString)
{
    reset();

    fEnd = XMLString::stringLen(aString);

    for (; fEnd > 0; fEnd--)
    {
        if (!XMLChar1_0::isWhitespace(aString[fEnd - 1]))
            break;
    }

    if (fEnd > 0) {

        if (fEnd > fBufferMaxLen)
        {
            fMemoryManager->deallocate(fBuffer);
            fBufferMaxLen = fEnd + 8;
            fBuffer = (XMLCh*) fMemoryManager->allocate((fBufferMaxLen+1) * sizeof(XMLCh));
        }

        memcpy(fBuffer, aString, (fEnd) * sizeof(XMLCh));
        fBuffer[fEnd] = '\0';
    }
}